

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  pointer pcVar2;
  iterator __position;
  cmGeneratorExpressionDAGChecker *pcVar3;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  cmGeneratorExpressionDAGChecker *pcVar5;
  int iVar6;
  cmValue cVar7;
  cmMakefile *mf;
  cmLocalGenerator *pcVar8;
  string *psVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_header *p_Var11;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar12;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  parentDagChecker;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmTarget dummyHead;
  cmGeneratorTarget *target;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  cmGeneratorExpressionDAGChecker *local_a10;
  string *local_a08;
  cmGeneratorExpression local_a00;
  cmTarget local_9f0;
  cmGeneratorExpressionDAGChecker *local_9e8;
  cmGeneratorTarget *local_9e0;
  undefined1 local_9d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8;
  long local_9b8 [2];
  string local_9a8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_988;
  cmGeneratorExpressionDAGChecker local_970;
  undefined1 local_8f0 [2240];
  
  local_a08 = language;
  cVar7 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (cVar7.Value == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_988.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_988.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_988);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_9d8,(cmListFileBacktrace *)&local_988);
    if (local_988.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_988.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_a10 = (cmGeneratorExpressionDAGChecker *)0x0;
    iVar6 = std::__cxx11::string::compare((char *)propName);
    if (iVar6 == 0) {
      local_9e8 = (cmGeneratorExpressionDAGChecker *)operator_new(0x80);
      local_8f0._0_8_ = local_8f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"LINK_OPTIONS","");
      pcVar3 = local_9e8;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                (local_9e8,tgt,(string *)local_8f0,(GeneratorExpressionContent *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      local_970.Parent = pcVar3;
      if ((undefined1 *)local_8f0._0_8_ != local_8f0 + 0x10) {
        operator_delete((void *)local_8f0._0_8_,local_8f0._16_8_ + 1);
      }
      pcVar5 = local_970.Parent;
      pcVar3 = local_a10;
      local_970.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
      local_a10 = pcVar5;
      if (pcVar3 != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                  ((default_delete<cmGeneratorExpressionDAGChecker> *)&local_a10,pcVar3);
      }
      if (local_970.Parent != (cmGeneratorExpressionDAGChecker *)0x0) {
        std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                  ((default_delete<cmGeneratorExpressionDAGChecker> *)&local_970,local_970.Parent);
      }
    }
    pcVar2 = (propName->_M_dataplus)._M_p;
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a8,pcVar2,pcVar2 + propName->_M_string_length);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_970,tgt,&local_9a8,(GeneratorExpressionContent *)0x0,local_a10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = ((cVar7.Value)->_M_dataplus)._M_p;
    local_9c8._M_allocated_capacity = (size_type)local_9b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_9d8 + 0x10),pcVar2,pcVar2 + (cVar7.Value)->_M_string_length);
    cmGeneratorExpression::Parse(&local_a00,(string *)local_9d8);
    if ((long *)local_9c8._M_allocated_capacity != local_9b8) {
      operator_delete((void *)local_9c8._M_allocated_capacity,local_9b8[0] + 1);
    }
    local_8f0._0_8_ = local_8f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"try_compile_dummy_exe","");
    mf = cmTarget::GetMakefile(tgt->Target);
    cmTarget::cmTarget(&local_9f0,(string *)local_8f0,EXECUTABLE,VisibilityNormal,mf,Yes);
    if ((undefined1 *)local_8f0._0_8_ != local_8f0 + 0x10) {
      operator_delete((void *)local_8f0._0_8_,local_8f0._16_8_ + 1);
    }
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    _Var4._M_pi = local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    cmGeneratorTarget::cmGeneratorTarget((cmGeneratorTarget *)local_8f0,&local_9f0,pcVar8);
    this_00 = local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(tgt);
    psVar9 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)this_00,pcVar8,&this->Config,
                        (cmGeneratorTarget *)local_8f0,&local_970,tgt,local_a08);
    local_a08 = (string *)(_Var4._M_pi + 1);
    ((_Alloc_hider *)&(_Var4._M_pi)->_vptr__Sp_counted_base)->_M_p = (pointer)local_a08;
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)_Var4._M_pi,pcVar2,pcVar2 + psVar9->_M_string_length);
    p_Var10 = (((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)((long)local_a00.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x80))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)((long)local_a00.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 0x80))->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var11) {
      do {
        local_9e0 = *(cmGeneratorTarget **)(p_Var10 + 1);
        pVar12 = std::
                 _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                 ::_M_insert_unique<cmGeneratorTarget_const*const&>
                           ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                             *)emitted,&local_9e0);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->Exports).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Exports).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &this->Exports,__position,&local_9e0);
          }
          else {
            *__position._M_current = local_9e0;
            pppcVar1 = &(this->Exports).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var11);
    }
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_8f0);
    cmTarget::~cmTarget(&local_9f0);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_a00);
    if (local_970.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_970.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_970.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970.Property._M_dataplus._M_p != &local_970.Property.field_2) {
      operator_delete(local_970.Property._M_dataplus._M_p,
                      local_970.Property.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ =
         (string *)
         local_a00.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_a10 != (cmGeneratorExpressionDAGChecker *)0x0) {
      std::default_delete<cmGeneratorExpressionDAGChecker>::operator()
                ((default_delete<cmGeneratorExpressionDAGChecker> *)&local_a10,local_a10);
    }
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_9d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  cmValue prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  std::unique_ptr<cmGeneratorExpressionDAGChecker> parentDagChecker;
  if (propName == "INTERFACE_LINK_OPTIONS") {
    // To please constraint checks of DAGChecker, this property must have
    // LINK_OPTIONS property as parent
    parentDagChecker = cm::make_unique<cmGeneratorExpressionDAGChecker>(
      tgt, "LINK_OPTIONS", nullptr, nullptr);
  }
  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr,
                                             parentDagChecker.get());

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile(),
                     cmTarget::PerConfig::Yes);

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     &gDummyHead, &dagChecker, tgt, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}